

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O0

void test_intersects(void)

{
  bitset_t *b1;
  bitset_t *b2;
  int i;
  unsigned_long unaff_retaddr;
  bitset_t *odds;
  bitset_t *evens;
  undefined4 in_stack_ffffffffffffffe8;
  int line;
  
  b1 = bitset_create();
  b2 = bitset_create();
  for (line = 0; line < 1000; line = line + 1) {
    if (line % 2 == 0) {
      bitset_set(b2,CONCAT44(line,in_stack_ffffffffffffffe8));
    }
    else {
      bitset_set(b2,CONCAT44(line,in_stack_ffffffffffffffe8));
    }
  }
  bitsets_intersect(b1,b2);
  _assert_true(unaff_retaddr,(char *)b1,(char *)b2,line);
  bitset_set(b2,CONCAT44(line,in_stack_ffffffffffffffe8));
  bitset_set(b2,CONCAT44(line,in_stack_ffffffffffffffe8));
  bitsets_intersect(b1,b2);
  _assert_true(unaff_retaddr,(char *)b1,(char *)b2,line);
  bitset_free((bitset_t *)0x1031b1);
  bitset_free((bitset_t *)0x1031bb);
  return;
}

Assistant:

void test_intersects() {
    bitset_t *evens = bitset_create();
    bitset_t *odds = bitset_create();

    for (int i = 0; i < 1000; i++) {
        if (i % 2 == 0)
            bitset_set(evens, i);
        else
            bitset_set(odds, i);
    }

    assert_true(!bitsets_intersect(evens, odds));

    bitset_set(evens, 1001);
    bitset_set(odds, 1001);

    assert_true(bitsets_intersect(evens, odds));

    bitset_free(evens);
    bitset_free(odds);
}